

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.hpp
# Opt level: O2

void __thiscall
optimization::sanity_check::SanityCheck::optimize_mir
          (SanityCheck *this,MirPackage *mir,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data_repo)

{
  _Base_ptr p_Var1;
  logic_error *this_00;
  
  for (p_Var1 = (mir->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(mir->functions)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (*(char *)&p_Var1[3]._M_parent[1]._M_left == '\0') {
      optimize_func(this,(MirFunction *)(p_Var1 + 2));
    }
  }
  if (this->failed == false) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Sanity check failed! please see log");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void optimize_mir(mir::inst::MirPackage &mir,
                    std::map<std::string, std::any> &extra_data_repo) override {
    for (auto &f : mir.functions) {
      if (!f.second.type->is_extern) {
        optimize_func(f.second);
      }
    }
    if (failed) throw std::logic_error("Sanity check failed! please see log");
  }